

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepTiledOutputFile::writeTiles
          (DeepTiledOutputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  value_type pTVar1;
  bool bVar2;
  size_type sVar3;
  ArgExc *pAVar4;
  ostream *poVar5;
  int *piVar6;
  TileBuffer *this_00;
  TileBufferTask *this_01;
  size_type sVar7;
  reference ppTVar8;
  IoExc *this_02;
  int in_ECX;
  int in_EDX;
  char *unaff_RBX;
  int in_ESI;
  void *__stat_loc;
  DeepTiledOutputFile *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 unaff_R14;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  Int64 in_stack_00000020;
  Int64 in_stack_00000028;
  char *in_stack_00000030;
  Int64 in_stack_00000038;
  stringstream _iex_replace_s;
  BaseExc *e;
  TileBuffer *tileBuffer;
  size_t i;
  string *exception;
  TileBuffer *writeBuffer;
  int dyWrite;
  int dxWrite;
  int nextWriteBuffer;
  int dyComp;
  int dxComp;
  int nextCompBuffer;
  TaskGroup taskGroup;
  int numTasks;
  int numTiles;
  int dY;
  int dyStart;
  stringstream _iex_throw_s;
  Lock lock;
  Lock *in_stack_fffffffffffffb80;
  DeepTiledOutputFile *in_stack_fffffffffffffb88;
  Data *in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffbb4;
  int in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbbc;
  Data *in_stack_fffffffffffffbc0;
  TaskGroup *in_stack_fffffffffffffbc8;
  TileBufferTask *in_stack_fffffffffffffbd0;
  Task *in_stack_fffffffffffffbe0;
  size_type local_228;
  string *local_220;
  int local_20c;
  uint local_208;
  int local_200;
  int local_1fc;
  TaskGroup local_1f8 [12];
  int local_1ec;
  int local_1e8;
  int local_1e4 [3];
  stringstream local_1d8 [16];
  ostream local_1c8 [412];
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c [3];
  
  local_2c = in_R9D;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_EDX;
  local_1c[0] = in_ESI;
  IlmThread_2_5::Lock::Lock
            ((Lock *)in_stack_fffffffffffffb90,(Mutex *)in_stack_fffffffffffffb88,
             SUB81((ulong)in_stack_fffffffffffffb80 >> 0x38,0));
  sVar3 = std::
          vector<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TOutSliceInfo_*>_>
          ::size(&in_RDI->_data->slices);
  if (sVar3 == 0) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,"No frame buffer specified as pixel data source.");
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  bVar2 = isValidTile(in_RDI,local_1c[0],local_24,local_2c,in_stack_00000008);
  if ((!bVar2) || (bVar2 = isValidTile(in_RDI,local_20,local_28,local_2c,in_stack_00000008), !bVar2)
     ) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,"Tile coordinates are invalid.");
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  bVar2 = isValidLevel(in_stack_fffffffffffffb88,(int)((ulong)in_stack_fffffffffffffb80 >> 0x20),
                       (int)in_stack_fffffffffffffb80);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1d8);
    poVar5 = std::operator<<(local_1c8,"Level coordinate (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2c);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_00000008);
    std::operator<<(poVar5,") is invalid.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar4,local_1d8);
    __cxa_throw(pAVar4,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if (local_20 < local_1c[0]) {
    std::swap<int>(local_1c,&local_20);
  }
  if (local_28 < local_24) {
    std::swap<int>(&local_24,&local_28);
  }
  local_1e4[2] = local_24;
  local_1e4[1] = 1;
  if (in_RDI->_data->lineOrder == DECREASING_Y) {
    local_1e4[2] = local_28;
    local_1e4[1] = 0xffffffff;
  }
  local_1e4[0] = ((local_20 - local_1c[0]) + 1) * ((local_28 - local_24) + 1);
  sVar3 = std::
          vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
          ::size(&in_RDI->_data->tileBuffers);
  local_1ec = (int)sVar3;
  piVar6 = std::min<int>(&local_1ec,local_1e4);
  local_1e8 = *piVar6;
  IlmThread_2_5::TaskGroup::TaskGroup(local_1f8);
  local_1fc = 0;
  local_200 = local_1c[0];
  while (local_1fc < local_1e8) {
    in_stack_fffffffffffffbe0 = (Task *)operator_new(0x20);
    local_1fc = local_1fc + 1;
    in_stack_fffffffffffffb80 =
         (Lock *)CONCAT44((int)((ulong)in_stack_fffffffffffffb80 >> 0x20),in_stack_00000008);
    anon_unknown_7::TileBufferTask::TileBufferTask
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
               in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
               (int)in_stack_fffffffffffffbe0,(int)piVar6);
    IlmThread_2_5::ThreadPool::addGlobalTask(in_stack_fffffffffffffbe0);
    local_200 = local_200 + 1;
    if (local_20 < local_200) {
      local_200 = local_1c[0];
    }
  }
  local_208 = 0;
  local_20c = local_1c[0];
  while ((int)local_208 < local_1e4[0]) {
    __stat_loc = (void *)(ulong)local_208;
    this_00 = Data::getTileBuffer(in_stack_fffffffffffffb90,
                                  (int)((ulong)in_stack_fffffffffffffb88 >> 0x20));
    anon_unknown_7::TileBuffer::wait((TileBuffer *)this_00,__stat_loc);
    in_stack_fffffffffffffb80 = *(Lock **)&this_00->format;
    in_stack_fffffffffffffb88 = (DeepTiledOutputFile *)(this_00->exception)._M_string_length;
    in_stack_fffffffffffffb90 = (Data *)(this_00->exception).field_2._M_allocated_capacity;
    anon_unknown_7::bufferedTileWrite
              ((Data *)CONCAT44(in_stack_0000000c,in_stack_00000008),unaff_retaddr_00,unaff_retaddr,
               (int)((ulong)unaff_R14 >> 0x20),(int)unaff_R14,unaff_RBX,in_stack_00000020,
               in_stack_00000028,in_stack_00000030,in_stack_00000038);
    anon_unknown_7::TileBuffer::post((TileBuffer *)0x1f66d2);
    if (local_1fc < local_1e4[0]) {
      this_01 = (TileBufferTask *)operator_new(0x20);
      in_stack_fffffffffffffb80 =
           (Lock *)CONCAT44((int)((ulong)in_stack_fffffffffffffb80 >> 0x20),in_stack_00000008);
      anon_unknown_7::TileBufferTask::TileBufferTask
                (this_01,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                 in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                 (int)in_stack_fffffffffffffbe0,(int)piVar6);
      IlmThread_2_5::ThreadPool::addGlobalTask(&this_01->super_Task);
    }
    local_208 = local_208 + 1;
    local_20c = local_20c + 1;
    if (local_20 < local_20c) {
      local_20c = local_1c[0];
    }
    local_1fc = local_1fc + 1;
    local_200 = local_200 + 1;
    if (local_20 < local_200) {
      local_200 = local_1c[0];
    }
  }
  IlmThread_2_5::TaskGroup::~TaskGroup(local_1f8);
  local_220 = (string *)0x0;
  local_228 = 0;
  while (sVar3 = local_228,
        sVar7 = std::
                vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ::size(&in_RDI->_data->tileBuffers), sVar3 < sVar7) {
    ppTVar8 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[](&in_RDI->_data->tileBuffers,local_228);
    pTVar1 = *ppTVar8;
    if (((pTVar1->field_0x68 & 1) != 0) && (local_220 == (string *)0x0)) {
      local_220 = (string *)&pTVar1->field_0x70;
    }
    pTVar1->field_0x68 = 0;
    local_228 = local_228 + 1;
  }
  if (local_220 == (string *)0x0) {
    IlmThread_2_5::Lock::~Lock(in_stack_fffffffffffffb80);
    return;
  }
  this_02 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::IoExc::IoExc(this_02,local_220);
  __cxa_throw(this_02,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
}

Assistant:

void
DeepTiledOutputFile::writeTiles (int dx1, int dx2, int dy1, int dy2,
                             int lx, int ly)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data source.");

        if (!isValidTile (dx1, dy1, lx, ly) || !isValidTile (dx2, dy2, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tile coordinates are invalid.");

        if (!isValidLevel (lx, ly))
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");
        //
        // Determine the first and last tile coordinates in both dimensions
        // based on the file's lineOrder
        //

        if (dx1 > dx2)
            swap (dx1, dx2);

        if (dy1 > dy2)
            swap (dy1, dy2);

        int dyStart = dy1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dY      = -1;
        }

        int numTiles = (dx2 - dx1 + 1) * (dy2 - dy1 + 1);
        int numTasks = min ((int)_data->tileBuffers.size(), numTiles);

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add in the initial compression tasks to the thread pool
            //

            int nextCompBuffer = 0;
            int dxComp         = dx1;
            int dyComp         = dyStart;

            while (nextCompBuffer < numTasks)
            {
                ThreadPool::addGlobalTask (new TileBufferTask (&taskGroup,
                                                               _data,
                                                               nextCompBuffer++,
                                                               dxComp, dyComp,
                                                               lx, ly));
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // Write the compressed buffers and add in more compression
            // tasks until done
            //

            int nextWriteBuffer = 0;
            int dxWrite         = dx1;
            int dyWrite         = dyStart;

            while (nextWriteBuffer < numTiles)
            {
                //
                // Wait until the nextWriteBuffer is ready to be written
                //

                TileBuffer* writeBuffer =
                                    _data->getTileBuffer (nextWriteBuffer);

                writeBuffer->wait();

                //
                // Write the tilebuffer
                //

                bufferedTileWrite ( _data, dxWrite, dyWrite, lx, ly,
                                   writeBuffer->dataPtr,
                                   writeBuffer->dataSize,
                                   writeBuffer->uncompressedSize,
                                   writeBuffer->sampleCountTablePtr,
                                   writeBuffer->sampleCountTableSize);

                //
                // Release the lock on nextWriteBuffer
                //

                writeBuffer->post();

                //
                // If there are no more tileBuffers to compress, then
                // only continue to write out remaining tileBuffers,
                // otherwise keep adding compression tasks.
                //

                if (nextCompBuffer < numTiles)
                {
                    //
                    // add nextCompBuffer as a compression Task
                    //

                    ThreadPool::addGlobalTask
                        (new TileBufferTask (&taskGroup,
                                             _data,
                                             nextCompBuffer,
                                             dxComp, dyComp,
                                             lx, ly));
                }

                nextWriteBuffer++;
                dxWrite++;

                if (dxWrite > dx2)
                {
                    dxWrite = dx1;
                    dyWrite += dY;
                }

                nextCompBuffer++;
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledOutputFile::writeTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size(); ++i)
        {
            TileBuffer *tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Failed to write pixel data to image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}